

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

void __thiscall
apngasm::APNGAsm::get_rect
          (APNGAsm *this,uint w,uint h,uchar *pimage1,uchar *pimage2,uchar *ptemp,uchar coltype,
          uint bpp,uint stride,int zbuf_size,uint has_tcolor,uint tcolor,int n)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ushort uVar11;
  uchar *puVar12;
  uint uVar13;
  uchar *puVar14;
  uint x;
  uint uVar15;
  int h_00;
  uint uVar16;
  uchar *pb;
  uint3 *puVar17;
  uint y;
  bool bVar18;
  bool bVar19;
  
  bVar19 = has_tcolor != 0;
  iVar10 = 1;
  if (3 < bpp - 1) {
    y = 0;
    h_00 = 1;
    x = 0;
    goto LAB_0013bf80;
  }
  x = w - 1;
  y = h - 1;
  switch(bpp) {
  case 1:
    if (h == 0) {
LAB_0013bf3d:
      y = 0;
      h_00 = 1;
      x = 0;
      goto LAB_0013bf80;
    }
    uVar2 = (ulong)x;
    uVar4 = 0;
    iVar10 = 0;
    uVar15 = 0;
    uVar1 = 0;
    puVar12 = pimage2;
    puVar14 = ptemp;
    do {
      if (w != 0) {
        lVar5 = 0;
        do {
          bVar6 = puVar12[lVar5];
          if (pimage1[lVar5] == bVar6) {
            bVar6 = (byte)tcolor;
          }
          else {
            bVar18 = bVar19;
            if (bVar6 == tcolor) {
              bVar18 = false;
            }
            if (coltype != '\0') {
              bVar18 = bVar19;
            }
            if (has_tcolor == 0) {
              bVar18 = bVar19;
            }
            bVar19 = bVar18;
            if ((coltype == '\x03') && (this->_trns[bVar6] != 0xff)) {
              bVar19 = false;
            }
            iVar10 = iVar10 + 1;
            uVar16 = (uint)lVar5;
            if (uVar16 < x) {
              x = uVar16;
            }
            if (uVar1 < uVar16) {
              uVar1 = uVar16;
            }
            if (uVar4 < y) {
              y = uVar4;
            }
            if (uVar15 < uVar4) {
              uVar15 = uVar4;
            }
          }
          puVar14[lVar5] = bVar6;
          lVar5 = lVar5 + 1;
        } while (w != (uint)lVar5);
        pimage1 = pimage1 + uVar2 + 1;
        puVar14 = puVar14 + lVar5;
        puVar12 = puVar12 + lVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != h);
    break;
  case 2:
    if (h == 0) goto LAB_0013bf3d;
    uVar4 = 0;
    iVar10 = 0;
    uVar15 = 0;
    uVar1 = 0;
    puVar12 = pimage2;
    puVar14 = ptemp;
    do {
      if (w != 0) {
        lVar5 = 0;
        lVar9 = 0;
        do {
          uVar11 = *(ushort *)(puVar12 + lVar9 * 2);
          if ((*(ushort *)(pimage1 + lVar9 * 2) == uVar11) ||
             ((uVar11 | *(ushort *)(pimage1 + lVar9 * 2)) < 0x100)) {
            uVar11 = 0;
          }
          else {
            iVar10 = iVar10 + 1;
            if (uVar11 < 0xff00) {
              bVar19 = false;
            }
            uVar16 = (uint)lVar9;
            if (uVar16 < x) {
              x = uVar16;
            }
            if (uVar1 < uVar16) {
              uVar1 = uVar16;
            }
            if (uVar4 < y) {
              y = uVar4;
            }
            if (uVar15 < uVar4) {
              uVar15 = uVar4;
            }
          }
          *(ushort *)(puVar14 + lVar9 * 2) = uVar11;
          lVar9 = lVar9 + 1;
          lVar5 = lVar5 + -2;
        } while (w != (uint)lVar9);
        puVar14 = puVar14 + -lVar5;
        puVar12 = puVar12 + -lVar5;
        pimage1 = pimage1 + -lVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != h);
    break;
  case 3:
    if (h == 0) goto LAB_0013bf3d;
    uVar13 = 0;
    iVar10 = 0;
    uVar15 = 0;
    uVar1 = 0;
    puVar12 = ptemp;
    puVar17 = (uint3 *)pimage2;
    uVar4 = x;
    uVar16 = y;
    do {
      if (w != 0) {
        uVar3 = 0;
        do {
          uVar7 = (uint)*puVar17;
          uVar8 = tcolor;
          if (*(uint3 *)pimage1 != uVar7) {
            iVar10 = iVar10 + 1;
            bVar18 = bVar19;
            if (uVar7 == tcolor) {
              bVar18 = false;
            }
            if (has_tcolor != 0) {
              bVar19 = bVar18;
            }
            bVar18 = uVar3 < x;
            x = uVar4;
            if (bVar18) {
              x = uVar3;
            }
            if (uVar1 < uVar3) {
              uVar1 = uVar3;
            }
            bVar18 = uVar13 < y;
            y = uVar16;
            if (bVar18) {
              y = uVar13;
            }
            uVar8 = uVar7;
            uVar4 = x;
            uVar16 = y;
            if (uVar15 < uVar13) {
              uVar15 = uVar13;
            }
          }
          *(short *)puVar12 = (short)uVar8;
          puVar12[2] = (uchar)(uVar8 >> 0x10);
          pimage1 = (uchar *)((long)pimage1 + 3);
          puVar17 = (uint3 *)((long)puVar17 + 3);
          puVar12 = puVar12 + 3;
          uVar3 = uVar3 + 1;
        } while (w != uVar3);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != h);
    break;
  case 4:
    if (h == 0) goto LAB_0013bf3d;
    uVar4 = 0;
    iVar10 = 0;
    uVar15 = 0;
    uVar1 = 0;
    puVar12 = ptemp;
    puVar14 = pimage2;
    do {
      if (w != 0) {
        lVar5 = 0;
        lVar9 = 0;
        do {
          uVar16 = *(uint *)(puVar14 + lVar9 * 4);
          if ((*(uint *)(pimage1 + lVar9 * 4) == uVar16) ||
             ((*(uint *)(pimage1 + lVar9 * 4) | uVar16) < 0x1000000)) {
            uVar16 = 0;
          }
          else {
            iVar10 = iVar10 + 1;
            if (uVar16 < 0xff000000) {
              bVar19 = false;
            }
            uVar13 = (uint)lVar9;
            if (uVar13 < x) {
              x = uVar13;
            }
            if (uVar1 < uVar13) {
              uVar1 = uVar13;
            }
            if (uVar4 < y) {
              y = uVar4;
            }
            if (uVar15 < uVar4) {
              uVar15 = uVar4;
            }
          }
          *(uint *)(puVar12 + lVar9 * 4) = uVar16;
          lVar9 = lVar9 + 1;
          lVar5 = lVar5 + -4;
        } while (w != (uint)lVar9);
        puVar12 = puVar12 + -lVar5;
        puVar14 = puVar14 + -lVar5;
        pimage1 = pimage1 + -lVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != h);
  }
  if (iVar10 == 0) {
    y = 0;
    h_00 = 1;
    x = 0;
    iVar10 = 1;
  }
  else {
    iVar10 = (uVar1 - x) + 1;
    h_00 = (uVar15 - y) + 1;
  }
LAB_0013bf80:
  deflate_rect_op(this,pimage2,x,y,iVar10,h_00,bpp,stride,zbuf_size,n * 2);
  if (bVar19) {
    deflate_rect_op(this,ptemp,x,y,iVar10,h_00,bpp,stride,zbuf_size,n * 2 | 1);
  }
  return;
}

Assistant:

void APNGAsm::get_rect(unsigned int w, unsigned int h, unsigned char *pimage1, unsigned char *pimage2, unsigned char *ptemp, unsigned char coltype, unsigned int bpp, unsigned int stride, int zbuf_size, unsigned int has_tcolor, unsigned int tcolor, int n)
  {
    unsigned int   i, j, x0, y0, w0, h0;
    unsigned int   x_min = w-1;
    unsigned int   y_min = h-1;
    unsigned int   x_max = 0;
    unsigned int   y_max = 0;
    unsigned int   diffnum = 0;
    unsigned int   over_is_possible = 1;

    if (!has_tcolor)
      over_is_possible = 0;

    if (bpp == 1)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned char c = *pb++;
        if (*pa++ != c)
        {
          diffnum++;
          if (coltype == 0 && has_tcolor && c == tcolor) over_is_possible = 0;
          if (coltype == 3 && _trns[c] != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c = tcolor;

        *pc++ = c;
      }
    }
    else
    if (bpp == 2)
    {
      unsigned short *pa = (unsigned short *)pimage1;
      unsigned short *pb = (unsigned short *)pimage2;
      unsigned short *pc = (unsigned short *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>8) || (c2>>8)))
        {
          diffnum++;
          if ((c2 >> 8) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }
    else
    if (bpp == 3)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = (pa[2]<<16) + (pa[1]<<8) + pa[0];
        unsigned int c2 = (pb[2]<<16) + (pb[1]<<8) + pb[0];
        if (c1 != c2)
        {
          diffnum++;
          if (has_tcolor && c2 == tcolor) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = tcolor;

        memcpy(pc, &c2, 3);
        pa += 3;
        pb += 3;
        pc += 3;
      }
    }
    else
    if (bpp == 4)
    {
      unsigned int *pa = (unsigned int *)pimage1;
      unsigned int *pb = (unsigned int *)pimage2;
      unsigned int *pc = (unsigned int *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>24) || (c2>>24)))
        {
          diffnum++;
          if ((c2 >> 24) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }

    if (diffnum == 0)
    {
      x0 = y0 = 0;
      w0 = h0 = 1;
    }
    else
    {
      x0 = x_min;
      y0 = y_min;
      w0 = x_max-x_min+1;
      h0 = y_max-y_min+1;
    }

    deflate_rect_op(pimage2, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2);

    if (over_is_possible)
      deflate_rect_op(ptemp, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2+1);
  }